

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_bin_lower_slab(tsdn_t *tsdn,arena_t *arena,edata_t *slab,bin_t *bin)

{
  edata_t *slab_00;
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  slab_00 = (edata_t *)slab[1].field_6.e_slab_data.bitmap[4];
  if ((slab_00 != (edata_t *)0x0) &&
     (pvVar1 = slab_00->e_addr, uVar2 = slab_00->e_sn, uVar3 = (arena->stats).metadata_edata,
     iVar5 = ((uint)(uVar2 >= uVar3 && uVar2 != uVar3) - (uint)(uVar2 < uVar3)) * 2,
     pvVar4 = *(void **)&arena->binshard_next,
     iVar6 = (uint)(pvVar1 >= pvVar4 && pvVar1 != pvVar4) - (uint)(pvVar1 < pvVar4),
     iVar7 = iVar6 + iVar5, iVar7 != 0 && SCARRY4(iVar6,iVar5) == iVar7 < 0)) {
    if ((slab_00->e_bits & 0x3ff0000000) == 0) {
      arena_bin_slabs_full_insert((arena_t *)tsdn,(bin_t *)slab,slab_00);
    }
    else {
      arena_bin_slabs_nonfull_insert((bin_t *)slab,slab_00);
    }
    slab[1].field_6.e_slab_data.bitmap[4] = (bitmap_t)arena;
    slab[1].field_5.ql_link_active.qre_next =
         (edata_t *)((long)&(slab[1].field_5.ql_link_active.qre_next)->e_bits + 1);
    return;
  }
  arena_bin_slabs_nonfull_insert((bin_t *)slab,(edata_t *)arena);
  return;
}

Assistant:

static void
arena_bin_lower_slab(tsdn_t *tsdn, arena_t *arena, edata_t *slab,
    bin_t *bin) {
	assert(edata_nfree_get(slab) > 0);

	/*
	 * Make sure that if bin->slabcur is non-NULL, it refers to the
	 * oldest/lowest non-full slab.  It is okay to NULL slabcur out rather
	 * than proactively keeping it pointing at the oldest/lowest non-full
	 * slab.
	 */
	if (bin->slabcur != NULL && edata_snad_comp(bin->slabcur, slab) > 0) {
		/* Switch slabcur. */
		if (edata_nfree_get(bin->slabcur) > 0) {
			arena_bin_slabs_nonfull_insert(bin, bin->slabcur);
		} else {
			arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		}
		bin->slabcur = slab;
		if (config_stats) {
			bin->stats.reslabs++;
		}
	} else {
		arena_bin_slabs_nonfull_insert(bin, slab);
	}
}